

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr type)

{
  Which WVar1;
  size_t sVar2;
  SourceFile *pSVar3;
  NullableValue<capnp::Schema> *other;
  Schema *pSVar4;
  StructSchema SVar5;
  StringPtr name;
  Reader local_a8;
  char *local_78;
  size_t sStack_70;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  NullableValue<capnp::Schema> schema;
  Fault local_30;
  Fault f;
  CompilerMain *this_local;
  StringPtr type_local;
  
  f.exception = (Exception *)this;
  sVar2 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::size(&this->sourceFiles);
  if (sVar2 == 1) {
    pSVar3 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::operator[](&this->sourceFiles,0)
    ;
    name.content.size_ = (size_t)type.content.ptr;
    name.content.ptr = (char *)pSVar3->id;
    local_78 = type.content.ptr;
    sStack_70 = type.content.size_;
    resolveName((CompilerMain *)local_60,(uint64_t)this,name);
    other = kj::_::readMaybe<capnp::Schema>((Maybe<capnp::Schema> *)local_60);
    kj::_::NullableValue<capnp::Schema>::NullableValue
              ((NullableValue<capnp::Schema> *)local_50,other);
    kj::Maybe<capnp::Schema>::~Maybe((Maybe<capnp::Schema> *)local_60);
    pSVar4 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_50);
    if (pSVar4 == (Schema *)0x0) {
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"no such type");
    }
    else {
      pSVar4 = kj::_::NullableValue<capnp::Schema>::operator->
                         ((NullableValue<capnp::Schema> *)local_50);
      Schema::getProto(&local_a8,pSVar4);
      WVar1 = capnp::schema::Node::Reader::which(&local_a8);
      if (WVar1 == STRUCT) {
        pSVar4 = kj::_::NullableValue<capnp::Schema>::operator->
                           ((NullableValue<capnp::Schema> *)local_50);
        SVar5 = Schema::asStruct(pSVar4);
        (this->rootType).super_Schema.raw = (RawBrandedSchema *)SVar5.super_Schema.raw;
        kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
      }
      else {
        kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"not a struct type");
      }
    }
    kj::_::NullableValue<capnp::Schema>::~NullableValue((NullableValue<capnp::Schema> *)local_50);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
             ,0x48f,FAILED,"sourceFiles.size() == 1","");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr type) {
    KJ_ASSERT(sourceFiles.size() == 1);

    KJ_IF_MAYBE(schema, resolveName(sourceFiles[0].id, type)) {
      if (schema->getProto().which() != schema::Node::STRUCT) {
        return "not a struct type";
      }
      rootType = schema->asStruct();
      return true;
    } else {
      return "no such type";
    }
  }